

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O3

void __thiscall lf::refinement::MeshHierarchy::initGeometryInParent(MeshHierarchy *this)

{
  double *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer psVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer paVar7;
  long *plVar8;
  pointer pPVar9;
  Entity *pEVar10;
  int *piVar11;
  tuple<const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_> tVar12;
  undefined1 auVar13 [16];
  _func_int **pp_Var14;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  source_loc loc_05;
  source_loc loc_06;
  double *pdVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined4 extraout_var;
  _Head_base<0UL,_const_lf::geometry::Geometry_*,_false> _Var20;
  __uniq_ptr_data<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>,_true,_true>
  _Var21;
  runtime_error *this_00;
  ostream *poVar22;
  undefined8 *puVar23;
  ulong uVar24;
  Index index;
  ulong uVar25;
  long extraout_RDX;
  long lVar26;
  XprTypeNested pMVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  _Head_base<0UL,_const_lf::geometry::Geometry_*,_false> _Var31;
  string *this_01;
  long lVar32;
  dim_t codim;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  string_view_t fmt_03;
  string_view_t fmt_04;
  string_view_t fmt_05;
  string_view_t fmt_06;
  RefEl parent_ref_el;
  Hybrid2DRefinementPattern rp;
  MatrixXd child_corners;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygon_vec;
  stringstream ss;
  MatrixXd nil_coords;
  size_type num_levels;
  RefEl local_311;
  string local_310;
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a0;
  scalar_quotient_op<double,_double> local_289;
  ulong local_288;
  uint local_27c;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_278;
  pointer local_260;
  undefined8 *local_258;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_250;
  _Head_base<0UL,_const_lf::geometry::Geometry_*,_false> local_238;
  XprTypeNested pMStack_230;
  char *local_228;
  variable_if_dynamic<long,__1> local_220;
  variable_if_dynamic<long,__1> local_218;
  scalar_constant_op<double> local_210;
  _func_int **local_b0;
  double local_a8;
  MeshHierarchy *local_a0;
  ulong local_98;
  element_type *local_90;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_88;
  _func_int **local_68;
  pointer local_60;
  pointer local_58;
  element_type *local_50;
  undefined8 *local_48;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *local_40;
  uint local_34;
  
  local_34 = (uint)((ulong)((long)(this->meshes_).
                                  super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->meshes_).
                                 super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  Logger();
  local_238._M_head_impl = (Geometry *)0x2af88f;
  pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x64a);
  local_228 = "initGeometryInParent";
  loc._8_8_ = pMStack_230;
  loc.filename = 
  "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
  ;
  loc.funcname = "initGeometryInParent";
  fmt.size_ = 0x37;
  fmt.data_ = "Entering MeshHierarchy::initGeometryInParent: {} levels";
  spdlog::logger::log_<unsigned_int_const&>
            (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             loc,debug,fmt,&local_34);
  if (local_34 < 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,"Must have been refined at least once",0x24);
    pp_Var14 = (_func_int **)(local_2b0 + 0x10);
    local_2b0._0_8_ = pp_Var14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"num_levels > 1","");
    paVar2 = &local_310.field_2;
    local_310._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2b0,&local_310,0x64e,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != paVar2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((_func_int **)local_2b0._0_8_ != pp_Var14) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                               aStack_2a0._M_allocated_capacity._0_4_) + 1);
    }
    local_2b0._0_8_ = pp_Var14;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"false","");
    local_310._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,"");
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
    base::AssertionFailed((string *)local_2b0,&local_310,0x64e,&local_2f0);
LAB_001c9a16:
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    this_01 = (string *)local_2b0;
LAB_001cb703:
    std::__cxx11::string::~string((string *)this_01);
    abort();
  }
  uVar28 = (ulong)(local_34 - 2);
  psVar4 = (this->meshes_).
           super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar25 = (long)(this->meshes_).
                 super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4;
  uVar24 = uVar28;
  if ((((uVar25 <= uVar28) || (uVar29 = (ulong)(local_34 - 1), uVar24 = uVar29, uVar25 <= uVar29))
      || (uVar25 = ((long)(this->point_child_infos_).
                          super__Vector_base<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->point_child_infos_).
                          super__Vector_base<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
         uVar24 = uVar28, uVar25 < uVar28 || uVar25 - uVar28 == 0)) ||
     ((pvVar5 = (this->edge_child_infos_).
                super__Vector_base<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar25 = ((long)(this->edge_child_infos_).
                      super__Vector_base<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x5555555555555555, uVar25 < uVar28 || uVar25 - uVar28 == 0 ||
      (pvVar6 = (this->cell_child_infos_).
                super__Vector_base<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar25 = ((long)(this->cell_child_infos_).
                      super__Vector_base<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
               -0x5555555555555555, local_a0 = this, uVar25 < uVar28 || uVar25 - uVar28 == 0)))) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24);
  }
  local_50 = psVar4[uVar28].super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90 = psVar4[uVar29].super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  local_88.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize(&local_88,0,1);
  local_58 = pvVar5 + uVar28;
  local_60 = pvVar6 + uVar28;
  uVar24 = 0;
  local_b0 = (_func_int **)&PTR_DimLocal_003416d0;
  local_68 = (_func_int **)&PTR_NumChildren_00341628;
  do {
    paVar7 = (local_a0->parent_infos_).
             super__Vector_base<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>,_std::allocator<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar17 = (*local_90->_vptr_Mesh[2])(local_90,uVar24 & 0xffffffff);
    puVar23 = (undefined8 *)CONCAT44(extraout_var,iVar17);
    if (extraout_RDX != 0) {
      local_40 = paVar7[-1]._M_elems + uVar24;
      local_48 = puVar23 + extraout_RDX;
      local_98 = uVar24;
      do {
        plVar8 = (long *)*puVar23;
        uVar18 = (*local_90->_vptr_Mesh[5])(local_90,plVar8);
        pPVar9 = (local_40->
                 super__Vector_base<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((_Head_base<0UL,_const_lf::geometry::Geometry_*,_false>)
            *(_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
              *)&pPVar9[uVar18].rel_ref_geo_._M_t.
                 super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
            != (Geometry *)0x0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"No double initialization of rel_ref_geo_",0x28);
          pp_Var14 = (_func_int **)(local_2b0 + 0x10);
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"child_pi.rel_ref_geo_ == nullptr","");
          paVar2 = &local_310.field_2;
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed((string *)local_2b0,&local_310,0x66a,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_2b0._0_8_ != pp_Var14) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"false","");
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
          base::AssertionFailed((string *)local_2b0,&local_310,0x66a,&local_2f0);
          goto LAB_001c9a16;
        }
        pPVar9 = pPVar9 + uVar18;
        local_288 = (ulong)pPVar9->child_number;
        if (local_288 == 0xffffffff) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"Child number missing",0x14);
          pp_Var14 = (_func_int **)(local_2b0 + 0x10);
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"child_number != idx_nil","");
          paVar2 = &local_310.field_2;
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed((string *)local_2b0,&local_310,0x66d,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_2b0._0_8_ != pp_Var14) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"false","");
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
          base::AssertionFailed((string *)local_2b0,&local_310,0x66d,&local_2f0);
          goto LAB_001c9a16;
        }
        pEVar10 = pPVar9->parent_ptr;
        if (pEVar10 == (Entity *)0x0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"No valid parent pointer",0x17);
          pp_Var14 = (_func_int **)(local_2b0 + 0x10);
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"child_pi.parent_ptr != nullptr","");
          paVar2 = &local_310.field_2;
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed((string *)local_2b0,&local_310,0x66f,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_2b0._0_8_ != pp_Var14) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"false","");
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
          base::AssertionFailed((string *)local_2b0,&local_310,0x66f,&local_2f0);
          goto LAB_001c9a16;
        }
        local_27c = uVar18;
        local_260 = pPVar9;
        iVar17 = (*pEVar10->_vptr_Entity[4])(pEVar10);
        local_311.type_ = (RefElType)iVar17;
        local_258 = puVar23;
        uVar18 = (**pEVar10->_vptr_Entity)(pEVar10);
        uVar19 = (*local_50->_vptr_Mesh[5])();
        if (uVar24 < uVar18) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_228,"Paren codim > child codim!",0x1a);
          pp_Var14 = (_func_int **)(local_2b0 + 0x10);
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,"parent_codim <= codim","");
          paVar2 = &local_310.field_2;
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed((string *)local_2b0,&local_310,0x678,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != paVar2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_2b0._0_8_ != pp_Var14) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT44(aStack_2a0._M_allocated_capacity._4_4_,
                                     aStack_2a0._M_allocated_capacity._0_4_) + 1);
          }
          local_2b0._0_8_ = pp_Var14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"false","");
          local_310._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,"");
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"");
          base::AssertionFailed((string *)local_2b0,&local_310,0x678,&local_2f0);
          goto LAB_001c9a16;
        }
        if (uVar18 != 2) {
          codim = (int)uVar24 - uVar18;
          if (uVar18 == 1) {
            lVar32 = *(long *)&(local_58->
                               super__Vector_base<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                               )._M_impl.super__Vector_impl_data;
            aStack_2a0._M_allocated_capacity._4_4_ = *(RefPat *)(lVar32 + (ulong)uVar19 * 0x38);
            local_2b0[8] = local_311.type_;
            local_2b0._12_4_ = 6;
            aStack_2a0._M_allocated_capacity._0_4_ = 0xffffffff;
            local_2b0._0_8_ = local_68;
            aStack_2a0._M_local_buf[8] = false;
            Hybrid2DRefinementPattern::ChildPolygons
                      (&local_250,(Hybrid2DRefinementPattern *)local_2b0,codim);
            uVar24 = ((long)local_250.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_250.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            if (uVar24 < local_288 || uVar24 - local_288 == 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Child number = ",0xf);
              poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
              std::__ostream_insert<char,std::char_traits<char>>(poVar22," >= ",4);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
              paVar2 = &local_310.field_2;
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_310,"child_number < child_polygon_vec.size()","");
              paVar3 = &local_2f0.field_2;
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed(&local_310,&local_2f0,0x6eb,&local_2d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
              base::AssertionFailed(&local_310,&local_2f0,0x6eb,&local_2d0);
            }
            else if (local_250.
                     super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_288].
                     super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                     == 1) {
              local_2f0._M_dataplus._M_p =
                   (pointer)(local_250.
                             super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_288);
              local_2d0._M_dataplus._M_p = (pointer)(double)(uint)local_2b0._12_4_;
              Eigen::
              CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
              ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                *)&local_310,1,
                               (((pointer)local_2f0._M_dataplus._M_p)->
                               super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).
                               m_storage.m_cols,(scalar_constant_op<double> *)&local_2d0);
              Eigen::
              CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&local_238,(Lhs *)&local_2f0,(Rhs *)&local_310,&local_289);
              local_278.m_storage.m_data = (double *)0x0;
              local_278.m_storage.m_rows = 0;
              local_278.m_storage.m_cols = 0;
              if ((local_218.m_value != 0 && local_220.m_value != 0) &&
                 (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
                 SUB168(auVar13 / SEXT816(local_218.m_value),0) < local_220.m_value)) {
                puVar23 = (undefined8 *)
                          __cxa_allocate_exception
                                    (8,local_220.m_value,
                                     SUB168(auVar13 % SEXT816(local_218.m_value),0));
                *puVar23 = &std::out_of_range::vtable;
                __cxa_throw(puVar23,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                        (&local_278,local_220.m_value,local_218.m_value);
              piVar11 = (pMStack_230->super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>)
                        .m_storage.m_data;
              local_a8 = local_210.m_other;
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,double,double>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278,
                         (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)&local_238,(assign_op<double,_double> *)&local_310);
              uVar24 = local_98;
              if (0 < local_278.m_storage.m_cols * local_278.m_storage.m_rows) {
                lVar26 = 0;
                do {
                  local_278.m_storage.m_data[lVar26] = (double)piVar11[lVar26] / local_a8;
                  lVar26 = lVar26 + 1;
                } while (local_278.m_storage.m_cols * local_278.m_storage.m_rows - lVar26 != 0);
              }
              lVar32 = lVar32 + (ulong)uVar19 * 0x38;
              if ((int)local_98 == 1) {
                if ((ulong)(*(long *)(lVar32 + 0x10) - *(long *)(lVar32 + 8) >> 2) <= local_288)
                goto LAB_001c9eb7;
                if (*(uint *)(*(long *)(lVar32 + 8) + local_288 * 4) == local_27c) {
                  cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                  puVar23 = local_258;
                  if (cVar16 == '\x02') {
                    if (local_278.m_storage.m_cols == 2) {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x701);
                      local_228 = "initGeometryInParent";
                      loc_03._8_8_ = pMStack_230;
                      loc_03.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_03.funcname = "initGeometryInParent";
                      fmt_03.size_ = 0x17;
                      fmt_03.data_ = "Segment in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_03,trace,fmt_03,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      std::
                      make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_238);
                      goto LAB_001c9405;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Segement must have two endpoints",0x20);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,"child_corners.cols() == 2","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6ff,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6ff,&local_2d0);
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be an edge!",0x10);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kSegment()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6fd,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6fd,&local_2d0);
                  }
                }
                else {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"edge_child_info.child_edge_idx.at(",0x22);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," ) !== child_idx",0x10);
                  paVar2 = &local_310.field_2;
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_310,
                             "parent_child_info.child_edge_idx.at(child_number) == child_idx","");
                  paVar3 = &local_2f0.field_2;
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x6fa,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                  base::AssertionFailed(&local_310,&local_2f0,0x6fa,&local_2d0);
                }
              }
              else {
                if ((int)local_98 != 2) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,
                             "Child of an edge can only be a point or a segment",0x31);
                  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x719,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,"this code should not be reached");
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if ((ulong)(*(long *)(lVar32 + 0x28) - *(long *)(lVar32 + 0x20) >> 2) <= local_288)
                {
LAB_001c9eb7:
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                }
                if (*(uint *)(*(long *)(lVar32 + 0x20) + local_288 * 4) == local_27c) {
                  cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                  puVar23 = local_258;
                  if (cVar16 == '\x01') {
                    if (local_278.m_storage.m_cols == 1) {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x711);
                      local_228 = "initGeometryInParent";
                      loc_00._8_8_ = pMStack_230;
                      loc_00.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_00.funcname = "initGeometryInParent";
                      fmt_00.size_ = 0x15;
                      fmt_00.data_ = "Point in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_00,trace,fmt_00,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      _Var20._M_head_impl = (Geometry *)operator_new(0x18);
                      local_238._M_head_impl = (Geometry *)0x0;
                      pMStack_230 = (XprTypeNested)0x0;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                      resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_238,
                                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_278)
                      ;
                      pdVar15 = local_278.m_storage.m_data;
                      Eigen::internal::
                      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278,
                                 (assign_op<double,_double> *)&local_310);
                      pMVar27 = (XprTypeNested)
                                ((long)pMStack_230 - ((long)pMStack_230 >> 0x3f) &
                                0xfffffffffffffffe);
                      if (1 < (long)pMStack_230) {
                        lVar32 = 0;
                        do {
                          pdVar1 = pdVar15 + lVar32;
                          pp_Var14 = (_func_int **)pdVar1[1];
                          local_238._M_head_impl[lVar32]._vptr_Geometry = (_func_int **)*pdVar1;
                          (local_238._M_head_impl + lVar32)[1]._vptr_Geometry = pp_Var14;
                          lVar32 = lVar32 + 2;
                        } while (lVar32 < (long)pMVar27);
                      }
                      if ((long)pMVar27 < (long)pMStack_230) {
                        do {
                          local_238._M_head_impl[(long)pMVar27]._vptr_Geometry =
                               (_func_int **)pdVar15[(long)pMVar27];
                          pMVar27 = (XprTypeNested)
                                    ((long)&(pMVar27->
                                            super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>
                                            ).m_storage.m_data + 1);
                        } while (pMStack_230 != pMVar27);
                      }
LAB_001c9336:
                      *_Var20._M_head_impl = (Geometry)local_b0;
                      *(Geometry **)
                       &(((Matrix<double,__1,_3,_0,__1,_3> *)((long)_Var20._M_head_impl + 8))->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage =
                           local_238._M_head_impl;
                      *(XprTypeNested *)((long)_Var20._M_head_impl + 0x10) = pMStack_230;
LAB_001c9359:
                      _Var31._M_head_impl =
                           *(Geometry **)
                            &(local_260->rel_ref_geo_)._M_t.
                             super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                      ;
                      (local_260->rel_ref_geo_)._M_t.
                      super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                           = (__uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                              )_Var20._M_head_impl;
LAB_001c943c:
                      if ((_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                           )_Var31._M_head_impl != (Geometry *)0x0) {
                        (*(_Var31._M_head_impl)->_vptr_Geometry[0xb])();
                      }
                      free(local_278.m_storage.m_data);
                      std::
                      vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                      ::~vector(&local_250);
                      goto LAB_001c9461;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Only a single coordindate for a point!",0x26);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,"child_corners.cols() == 1","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x70f,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x70f,&local_2d0);
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be a point!",0x10);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kPoint()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x70d,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x70d,&local_2d0);
                  }
                }
                else {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"edge_child_info.child_point_idx.at(",0x23);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," ) !== child_idx",0x10);
                  paVar2 = &local_310.field_2;
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_310,
                             "parent_child_info.child_point_idx.at( child_number) == child_idx","");
                  paVar3 = &local_2f0.field_2;
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x70b,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                  base::AssertionFailed(&local_310,&local_2f0,0x70b,&local_2d0);
                }
              }
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Need one coordinate only in parent segment",0x2a);
              paVar2 = &local_310.field_2;
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_310,"child_polygon.rows() == 1","");
              paVar3 = &local_2f0.field_2;
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed(&local_310,&local_2f0,0x6ef,&local_2d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
              base::AssertionFailed(&local_310,&local_2f0,0x6ef,&local_2d0);
            }
          }
          else {
            lVar32 = *(long *)&(local_60->
                               super__Vector_base<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                               )._M_impl.super__Vector_impl_data;
            lVar26 = (ulong)uVar19 * 0x50;
            Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
                      ((Hybrid2DRefinementPattern *)local_2b0,local_311,*(RefPat *)(lVar32 + lVar26)
                       ,*(sub_idx_t *)(lVar32 + 4 + lVar26));
            Hybrid2DRefinementPattern::ChildPolygons
                      (&local_250,(Hybrid2DRefinementPattern *)local_2b0,codim);
            uVar24 = ((long)local_250.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_250.
                            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            if (uVar24 < local_288 || uVar24 - local_288 == 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Child number = ",0xf);
              poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
              std::__ostream_insert<char,std::char_traits<char>>(poVar22," >= ",4);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
              paVar2 = &local_310.field_2;
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_310,"child_number < child_polygon_vec.size()","");
              paVar3 = &local_2f0.field_2;
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed(&local_310,&local_2f0,0x689,&local_2d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
              base::AssertionFailed(&local_310,&local_2f0,0x689,&local_2d0);
            }
            else if (local_250.
                     super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_288].
                     super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows
                     == 2) {
              local_2f0._M_dataplus._M_p =
                   (pointer)(local_250.
                             super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_288);
              local_2d0._M_dataplus._M_p = (pointer)(double)(uint)local_2b0._12_4_;
              Eigen::
              CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
              ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                *)&local_310,2,
                               (((pointer)local_2f0._M_dataplus._M_p)->
                               super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).
                               m_storage.m_cols,(scalar_constant_op<double> *)&local_2d0);
              Eigen::
              CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&local_238,(Lhs *)&local_2f0,(Rhs *)&local_310,&local_289);
              local_278.m_storage.m_data = (double *)0x0;
              local_278.m_storage.m_rows = 0;
              local_278.m_storage.m_cols = 0;
              if ((local_218.m_value != 0 && local_220.m_value != 0) &&
                 (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
                 SUB168(auVar13 / SEXT816(local_218.m_value),0) < local_220.m_value)) {
                puVar23 = (undefined8 *)
                          __cxa_allocate_exception
                                    (8,local_220.m_value,
                                     SUB168(auVar13 % SEXT816(local_218.m_value),0));
                *puVar23 = &std::out_of_range::vtable;
                __cxa_throw(puVar23,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                        (&local_278,local_220.m_value,local_218.m_value);
              piVar11 = (pMStack_230->super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>)
                        .m_storage.m_data;
              local_a8 = local_210.m_other;
              Eigen::internal::
              resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,double,double>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278,
                         (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)&local_238,(assign_op<double,_double> *)&local_310);
              uVar24 = local_98;
              puVar23 = local_258;
              if (0 < local_278.m_storage.m_rows * local_278.m_storage.m_cols) {
                lVar30 = 0;
                do {
                  local_278.m_storage.m_data[lVar30] = (double)piVar11[lVar30] / local_a8;
                  lVar30 = lVar30 + 1;
                } while (local_278.m_storage.m_rows * local_278.m_storage.m_cols - lVar30 != 0);
              }
              lVar32 = lVar32 + lVar26;
              if ((int)local_98 == 0) {
                if ((ulong)(*(long *)(lVar32 + 0x10) - *(long *)(lVar32 + 8) >> 2) <= local_288)
                goto LAB_001ca00d;
                if (*(uint *)(*(long *)(lVar32 + 8) + local_288 * 4) == local_27c) {
                  if (local_278.m_storage.m_cols == 4) {
                    cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                    puVar23 = local_258;
                    if (cVar16 == '\x04') {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x6aa);
                      local_228 = "initGeometryInParent";
                      loc_06._8_8_ = pMStack_230;
                      loc_06.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_06.funcname = "initGeometryInParent";
                      fmt_06.size_ = 0x14;
                      fmt_06.data_ = "Quad in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_06,trace,fmt_06,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      std::
                      make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_238);
LAB_001c9405:
                      _Var20._M_head_impl = local_238._M_head_impl;
                      local_238._M_head_impl = (Geometry *)0x0;
                      tVar12.
                      super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                      .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl =
                           *(_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                             *)&(local_260->rel_ref_geo_)._M_t.
                                super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                      ;
                      (local_260->rel_ref_geo_)._M_t.
                      super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                           = (__uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                              )_Var20._M_head_impl;
                      _Var31._M_head_impl = local_238._M_head_impl;
                      if (tVar12.
                          super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                          .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl
                          != (_Head_base<0UL,_const_lf::geometry::Geometry_*,_false>)0x0) {
                        (**(code **)(*(long *)tVar12.
                                              super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                                              .
                                              super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>
                                              ._M_head_impl + 0x58))();
                        _Var31._M_head_impl = local_238._M_head_impl;
                      }
                      goto LAB_001c943c;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be quad!",0xd);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kQuad()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6a8,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6a8,&local_2d0);
                  }
                  else if (local_278.m_storage.m_cols == 3) {
                    cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                    if (cVar16 == '\x03') {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x69f);
                      local_228 = "initGeometryInParent";
                      loc_04._8_8_ = pMStack_230;
                      loc_04.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_04.funcname = "initGeometryInParent";
                      fmt_04.size_ = 0x18;
                      fmt_04.data_ = "Triangle in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_04,trace,fmt_04,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      _Var20._M_head_impl = (Geometry *)operator_new(0x40);
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
                      PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)&local_238,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_278)
                      ;
                      geometry::TriaO1::TriaO1
                                ((TriaO1 *)_Var20._M_head_impl,
                                 (Matrix<double,__1,_3,_0,__1,_3> *)&local_238);
                      free(local_238._M_head_impl);
                      goto LAB_001c9359;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be triangle!",0x11);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kTria()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x69d,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x69d,&local_2d0);
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Illegal number ",0xf);
                    poVar22 = std::ostream::_M_insert<long>((long)&local_228);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22," of corners for a child cell",0x1c);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6b3,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6b3,&local_2d0);
                  }
                }
                else {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"parent_child_info.child_cell_idx.at(",0x24);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," ) !== child_idx",0x10);
                  paVar2 = &local_310.field_2;
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_310,
                             "parent_child_info.child_cell_idx.at(child_number) == child_idx","");
                  paVar3 = &local_2f0.field_2;
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x698,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                  base::AssertionFailed(&local_310,&local_2f0,0x698,&local_2d0);
                }
              }
              else if ((int)local_98 == 1) {
                if ((ulong)(*(long *)(lVar32 + 0x28) - *(long *)(lVar32 + 0x20) >> 2) <= local_288)
                {
LAB_001ca00d:
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                }
                if (*(uint *)(*(long *)(lVar32 + 0x20) + local_288 * 4) == local_27c) {
                  cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                  puVar23 = local_258;
                  if (cVar16 == '\x02') {
                    if (local_278.m_storage.m_cols == 2) {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x6c4);
                      local_228 = "initGeometryInParent";
                      loc_02._8_8_ = pMStack_230;
                      loc_02.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_02.funcname = "initGeometryInParent";
                      fmt_02.size_ = 0x17;
                      fmt_02.data_ = "Segment in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_02,trace,fmt_02,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      std::
                      make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_238);
                      goto LAB_001c9405;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Segement must have two endpoints",0x20);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,"child_corners.cols() == 2","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6c2,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6c2,&local_2d0);
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be an edge!",0x10);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kSegment()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6c0,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6c0,&local_2d0);
                  }
                }
                else {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"parent_child_info.child_edge_idx.at(",0x24);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," ) !== child_idx",0x10);
                  paVar2 = &local_310.field_2;
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_310,
                             "parent_child_info.child_edge_idx.at(child_number) == child_idx","");
                  paVar3 = &local_2f0.field_2;
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x6bd,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                  base::AssertionFailed(&local_310,&local_2f0,0x6bd,&local_2d0);
                }
              }
              else {
                if ((ulong)(*(long *)(lVar32 + 0x40) - *(long *)(lVar32 + 0x38) >> 2) <= local_288)
                goto LAB_001ca00d;
                if (*(uint *)(*(long *)(lVar32 + 0x38) + local_288 * 4) == local_27c) {
                  cVar16 = (**(code **)(*plVar8 + 0x20))(plVar8);
                  puVar23 = local_258;
                  if (cVar16 == '\x01') {
                    if (local_278.m_storage.m_cols == 1) {
                      Logger();
                      local_238._M_head_impl = (Geometry *)0x2af88f;
                      pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x6d4);
                      local_228 = "initGeometryInParent";
                      loc_05._8_8_ = pMStack_230;
                      loc_05.filename =
                           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                      ;
                      loc_05.funcname = "initGeometryInParent";
                      fmt_05.size_ = 0x15;
                      fmt_05.data_ = "Point in {}: geo = {}";
                      spdlog::logger::
                      log_<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                                (Logger::logger.
                                 super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,loc_05,trace,fmt_05,&local_311,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
                      _Var20._M_head_impl = (Geometry *)operator_new(0x18);
                      local_238._M_head_impl = (Geometry *)0x0;
                      pMStack_230 = (XprTypeNested)0x0;
                      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                      resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_238,
                                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_278)
                      ;
                      pdVar15 = local_278.m_storage.m_data;
                      Eigen::internal::
                      resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                                ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
                                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_278,
                                 (assign_op<double,_double> *)&local_310);
                      pMVar27 = (XprTypeNested)
                                ((long)pMStack_230 - ((long)pMStack_230 >> 0x3f) &
                                0xfffffffffffffffe);
                      if (1 < (long)pMStack_230) {
                        lVar32 = 0;
                        do {
                          pdVar1 = pdVar15 + lVar32;
                          pp_Var14 = (_func_int **)pdVar1[1];
                          local_238._M_head_impl[lVar32]._vptr_Geometry = (_func_int **)*pdVar1;
                          (local_238._M_head_impl + lVar32)[1]._vptr_Geometry = pp_Var14;
                          lVar32 = lVar32 + 2;
                        } while (lVar32 < (long)pMVar27);
                      }
                      if ((long)pMVar27 < (long)pMStack_230) {
                        do {
                          local_238._M_head_impl[(long)pMVar27]._vptr_Geometry =
                               (_func_int **)pdVar15[(long)pMVar27];
                          pMVar27 = (XprTypeNested)
                                    ((long)&(pMVar27->
                                            super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>
                                            ).m_storage.m_data + 1);
                        } while (pMStack_230 != pMVar27);
                      }
                      goto LAB_001c9336;
                    }
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Only a single coordindate for a point!",0x26);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,"child_corners.cols() == 1","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6d2,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6d2,&local_2d0);
                  }
                  else {
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_228,"Must be a point!",0x10);
                    paVar2 = &local_310.field_2;
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_310,
                               "child_entity->RefEl() == lf::base::RefEl::kPoint()","");
                    paVar3 = &local_2f0.field_2;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    std::__cxx11::stringbuf::str();
                    base::AssertionFailed(&local_310,&local_2f0,0x6d0,&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != paVar3) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_310._M_dataplus._M_p != paVar2) {
                      operator_delete(local_310._M_dataplus._M_p,
                                      local_310.field_2._M_allocated_capacity + 1);
                    }
                    local_310._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","")
                    ;
                    local_2f0._M_dataplus._M_p = (pointer)paVar3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                               ,"");
                    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                    base::AssertionFailed(&local_310,&local_2f0,0x6d0,&local_2d0);
                  }
                }
                else {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_228,"parent_child_info.child_point_idx.at(",0x25);
                  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22," ) !== child_idx",0x10);
                  paVar2 = &local_310.field_2;
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_310,
                             "parent_child_info.child_point_idx.at( child_number) == child_idx","");
                  paVar3 = &local_2f0.field_2;
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed(&local_310,&local_2f0,0x6ce,&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != paVar2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                  local_310._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
                  local_2f0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                             ,"");
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
                  base::AssertionFailed(&local_310,&local_2f0,0x6ce,&local_2d0);
                }
              }
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_238);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_228,"Need two coordinates in parent cell",0x23);
              paVar2 = &local_310.field_2;
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_310,"child_polygon.rows() == 2","");
              paVar3 = &local_2f0.field_2;
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed(&local_310,&local_2f0,0x68d,&local_2d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != paVar2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              local_310._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"false","");
              local_2f0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,"");
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
              base::AssertionFailed(&local_310,&local_2f0,0x68d,&local_2d0);
            }
          }
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          this_01 = &local_310;
          goto LAB_001cb703;
        }
        Logger();
        local_238._M_head_impl = (Geometry *)0x2af88f;
        pMStack_230 = (XprTypeNested)CONCAT44(pMStack_230._4_4_,0x721);
        local_228 = "initGeometryInParent";
        loc_01._8_8_ = pMStack_230;
        loc_01.filename =
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
        ;
        loc_01.funcname = "initGeometryInParent";
        fmt_01.size_ = 0xb;
        fmt_01.data_ = "point in {}";
        spdlog::logger::log_<lf::base::RefEl_const&>
                  (Logger::logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,loc_01,trace,fmt_01,&local_311);
        _Var21.
        super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
        .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl =
             (__uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
              )operator_new(0x18);
        local_238._M_head_impl = (Geometry *)0x0;
        pMStack_230 = (XprTypeNested)0x0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_238,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_88);
        pdVar15 = local_88.m_storage.m_data;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&local_238,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_88,
                   (assign_op<double,_double> *)local_2b0);
        puVar23 = local_258;
        pMVar27 = (XprTypeNested)
                  ((long)pMStack_230 - ((long)pMStack_230 >> 0x3f) & 0xfffffffffffffffe);
        if (1 < (long)pMStack_230) {
          lVar32 = 0;
          do {
            pdVar1 = pdVar15 + lVar32;
            pp_Var14 = (_func_int **)pdVar1[1];
            local_238._M_head_impl[lVar32]._vptr_Geometry = (_func_int **)*pdVar1;
            (local_238._M_head_impl + lVar32)[1]._vptr_Geometry = pp_Var14;
            lVar32 = lVar32 + 2;
          } while (lVar32 < (long)pMVar27);
        }
        if ((long)pMVar27 < (long)pMStack_230) {
          do {
            local_238._M_head_impl[(long)pMVar27]._vptr_Geometry =
                 (_func_int **)pdVar15[(long)pMVar27];
            pMVar27 = (XprTypeNested)
                      ((long)&(pMVar27->
                              super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 1);
          } while (pMStack_230 != pMVar27);
        }
        *(_func_int ***)
         _Var21.
         super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
         .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl = local_b0;
        *(Geometry **)
         ((long)_Var21.
                super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl + 8) =
             local_238._M_head_impl;
        *(XprTypeNested *)
         ((long)_Var21.
                super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl + 0x10) =
             pMStack_230;
        tVar12.
        super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
        .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
               *)&(local_260->rel_ref_geo_)._M_t.
                  super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
        ;
        (local_260->rel_ref_geo_)._M_t.
        super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
             = _Var21.
               super___uniq_ptr_impl<const_lf::geometry::Geometry,_std::default_delete<const_lf::geometry::Geometry>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
               .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl;
        if (tVar12.
            super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
            .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>._M_head_impl !=
            (_Head_base<0UL,_const_lf::geometry::Geometry_*,_false>)0x0) {
          (**(code **)(*(long *)tVar12.
                                super__Tuple_impl<0UL,_const_lf::geometry::Geometry_*,_std::default_delete<const_lf::geometry::Geometry>_>
                                .super__Head_base<0UL,_const_lf::geometry::Geometry_*,_false>.
                                _M_head_impl + 0x58))();
        }
LAB_001c9461:
        puVar23 = puVar23 + 1;
      } while (puVar23 != local_48);
    }
    uVar24 = uVar24 + 1;
    if (uVar24 == 3) {
      free(local_88.m_storage.m_data);
      return;
    }
  } while( true );
}

Assistant:

void MeshHierarchy::initGeometryInParent() {
  // number of meshes contained in the hierarchy
  const size_type num_levels = NumLevels();
  SPDLOG_LOGGER_DEBUG(Logger(),
                      "Entering MeshHierarchy::initGeometryInParent: {} levels",
                      num_levels);

  // Invoking this function makes sense only if the finest mesh has been
  // created by refinement.
  LF_ASSERT_MSG(num_levels > 1, "Must have been refined at least once");
  // Obtain references to finest and second finest mesh
  const lf::mesh::Mesh &parent_mesh{*meshes_.at(num_levels - 2)};
  const lf::mesh::Mesh &child_mesh{*meshes_.at(num_levels - 1)};
  // Partly intialized vectors of child information
  const std::vector<PointChildInfo> &pt_child_info{
      point_child_infos_.at(num_levels - 2)};
  std::vector<EdgeChildInfo> &ed_child_info{
      edge_child_infos_.at(num_levels - 2)};
  std::vector<CellChildInfo> &cell_child_info{
      cell_child_infos_.at(num_levels - 2)};
  // Dummy relative geometry for a point in a point
  const Eigen::MatrixXd nil_coords(0, 1);

  // Visit all entities of the fine mesh. Outer loop covers co-dimensions
  // starting with cells (codim = 0)
  for (dim_t codim = 0; codim <= 2; ++codim) {
    // Reference to ParentInfo vector for entities of co-dimension codim
    // of the new mesh
    std::vector<ParentInfo> &child_entities_parent_info(
        parent_infos_.back()[codim]);
    // Loop over all nodes of the new mesh (co-dimension = 2)
    for (const lf::mesh::Entity *child_entity : child_mesh.Entities(codim)) {
      // Obtain index of the child entity
      const glb_idx_t child_idx = child_mesh.Index(*child_entity);
      // Obtain ParentInfo for the current child entity
      ParentInfo &child_pi{child_entities_parent_info[child_idx]};
      LF_ASSERT_MSG(child_pi.rel_ref_geo_ == nullptr,
                    "No double initialization of rel_ref_geo_");
      // Get number of child
      const sub_idx_t child_number = child_pi.child_number;
      LF_ASSERT_MSG(child_number != idx_nil, "Child number missing");
      // Obtain parent entity
      LF_ASSERT_MSG(child_pi.parent_ptr != nullptr, "No valid parent pointer");
      const lf::mesh::Entity &parent{*child_pi.parent_ptr};
      // Obtain type of parent entity
      const lf::base::RefEl parent_ref_el(parent.RefEl());
      // Obtain co-dimension of parent entity
      const dim_t parent_codim = parent.Codim();
      // Index of parent entity
      const glb_idx_t parent_idx = parent_mesh.Index(parent);
      // Difference in co-dimensions
      LF_ASSERT_MSG(parent_codim <= codim, "Paren codim > child codim!");
      const dim_t child_rel_codim = codim - parent_codim;
      // Obtain local geometry of child. To that end we have to do
      // different things for different parent types
      switch (parent_codim) {
        case 0: {  // the parent entity is a cell
                   // Fetch refinement information
          const CellChildInfo &parent_child_info{cell_child_info[parent_idx]};
          const RefPat parent_ref_pat{parent_child_info.ref_pat_};
          const sub_idx_t anchor{parent_child_info.anchor_};
          // Obtain geometry of child
          const Hybrid2DRefinementPattern rp(parent_ref_el, parent_ref_pat,
                                             anchor);
          const std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
              child_polygon_vec{rp.ChildPolygons(child_rel_codim)};
          LF_ASSERT_MSG(child_number < child_polygon_vec.size(),
                        "Child number = " << child_number << " >= "
                                          << child_polygon_vec.size());
          const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>
              &child_polygon{child_polygon_vec[child_number]};
          LF_ASSERT_MSG(child_polygon.rows() == 2,
                        "Need two coordinates in parent cell");
          // Matrix containing the relative reference coordinates of the
          // child's corners in its columns
          const Eigen::MatrixXd child_corners =
              child_polygon.cast<double>() /
              static_cast<double>(rp.LatticeConst());
          switch (codim) {
            case 0: {  // cell in cell
              LF_ASSERT_MSG(parent_child_info.child_cell_idx.at(child_number) ==
                                child_idx,
                            "parent_child_info.child_cell_idx.at("
                                << child_number << " ) !== child_idx");
              switch (child_corners.cols()) {
                case 3: {  // Child is a triangle
                  LF_ASSERT_MSG(
                      child_entity->RefEl() == lf::base::RefEl::kTria(),
                      "Must be triangle!");
                  SPDLOG_LOGGER_TRACE(Logger(), "Triangle in {}: geo = {}",
                                      parent_ref_el, child_corners);

                  child_pi.rel_ref_geo_ =
                      std::make_unique<lf::geometry::TriaO1>(child_corners);
                  break;
                }
                case 4: {  // Child is a quadrilateral
                  LF_ASSERT_MSG(
                      child_entity->RefEl() == lf::base::RefEl::kQuad(),
                      "Must be quad!");
                  SPDLOG_LOGGER_TRACE(Logger(), "Quad in {}: geo = {}",
                                      parent_ref_el, child_corners);

                  child_pi.rel_ref_geo_ =
                      std::make_unique<lf::geometry::QuadO1>(child_corners);
                  break;
                }
                default: {
                  LF_ASSERT_MSG(false, "Illegal number "
                                           << child_corners.cols()
                                           << " of corners for a child cell");
                  break;
                }
              }
              break;
            }
            case 1: {  // segment in cell, child_rel_codim = 1
              LF_ASSERT_MSG(parent_child_info.child_edge_idx.at(child_number) ==
                                child_idx,
                            "parent_child_info.child_edge_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(
                  child_entity->RefEl() == lf::base::RefEl::kSegment(),
                  "Must be an edge!");
              LF_ASSERT_MSG(child_corners.cols() == 2,
                            "Segement must have two endpoints");
              SPDLOG_LOGGER_TRACE(Logger(), "Segment in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::SegmentO1>(child_corners);
              break;
            }
            case 2: {  // point in cell, child_rel_codim = 2
              LF_ASSERT_MSG(parent_child_info.child_point_idx.at(
                                child_number) == child_idx,
                            "parent_child_info.child_point_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(child_entity->RefEl() == lf::base::RefEl::kPoint(),
                            "Must be a point!");
              LF_ASSERT_MSG(child_corners.cols() == 1,
                            "Only a single coordindate for a point!");
              SPDLOG_LOGGER_TRACE(Logger(), "Point in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::Point>(child_corners);
              break;
            }
            default:
              LF_VERIFY_MSG(false, "unexpected codim " << codim);
          }  // end switch codim
          break;
        }
        case 1: {  // the parent entity is an edge
                   // Fetch refinement information
          const EdgeChildInfo &parent_child_info{ed_child_info[parent_idx]};
          const RefPat parent_ref_pat{parent_child_info.ref_pat_};
          const sub_idx_t anchor{idx_nil};
          // Obtain geometry of child
          const Hybrid2DRefinementPattern rp(parent_ref_el, parent_ref_pat,
                                             anchor);
          const std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
              child_polygon_vec{rp.ChildPolygons(child_rel_codim)};
          LF_ASSERT_MSG(child_number < child_polygon_vec.size(),
                        "Child number = " << child_number << " >= "
                                          << child_polygon_vec.size());
          const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>
              &child_polygon{child_polygon_vec[child_number]};
          LF_ASSERT_MSG(child_polygon.rows() == 1,
                        "Need one coordinate only in parent segment");
          // Row vector containing the relative reference coordinates of the
          // child's corners
          const Eigen::MatrixXd child_corners =
              child_polygon.cast<double>() /
              static_cast<double>(rp.LatticeConst());
          switch (codim) {
            case 1: {  // edge in edge, child_rel_codim = 0
              LF_ASSERT_MSG(parent_child_info.child_edge_idx.at(child_number) ==
                                child_idx,
                            "edge_child_info.child_edge_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(
                  child_entity->RefEl() == lf::base::RefEl::kSegment(),
                  "Must be an edge!");
              LF_ASSERT_MSG(child_corners.cols() == 2,
                            "Segement must have two endpoints");
              SPDLOG_LOGGER_TRACE(Logger(), "Segment in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::SegmentO1>(child_corners);
              break;
            }
            case 2: {  // point in edge
              LF_ASSERT_MSG(parent_child_info.child_point_idx.at(
                                child_number) == child_idx,
                            "edge_child_info.child_point_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(child_entity->RefEl() == lf::base::RefEl::kPoint(),
                            "Must be a point!");
              LF_ASSERT_MSG(child_corners.cols() == 1,
                            "Only a single coordindate for a point!");
              SPDLOG_LOGGER_TRACE(Logger(), "Point in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::Point>(child_corners);
              break;
            }
            default: {
              LF_VERIFY_MSG(
                  false, "Child of an edge can only be a point or a segment");
              break;
            }
          }  // end switch codim
          break;
        }
        case 2: {  // the parent entity is a point
          // No relative geometry for a point
          SPDLOG_LOGGER_TRACE(Logger(), "point in {}", parent_ref_el);
          child_pi.rel_ref_geo_ =
              std::make_unique<lf::geometry::Point>(nil_coords);
          break;
        }
        default: {
          LF_VERIFY_MSG(false, "Illegal parent co-dimension" << parent_codim);
          break;
        }
      }  // end switch(parent_codim)
    }  // end loop over entities of the fine mesh
  }  // end loop over codims
}